

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::Clara::addOptName(Arg *arg,string *optName)

{
  string *__rhs;
  bool bVar1;
  logic_error *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (optName->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"--",(allocator<char> *)&local_60);
    bVar1 = Detail::startsWith(optName,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      __rhs = &(arg->super_OptionArgProperties).longName;
      if ((arg->super_OptionArgProperties).longName._M_string_length != 0) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_80,"Only one long opt may be specified. \'",__rhs);
        std::operator+(&local_a0,&local_80,"\' already specified, now attempting to add \'");
        std::operator+(&local_60,&local_a0,optName);
        std::operator+(&local_40,&local_60,"\'");
        std::logic_error::logic_error(plVar2,(string *)&local_40);
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)&local_40,(ulong)optName);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_40);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"-",(allocator<char> *)&local_60);
      bVar1 = Detail::startsWith(optName,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar1) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_60,"option must begin with - or --. Option was: \'",optName);
        std::operator+(&local_40,&local_60,"\'");
        std::logic_error::logic_error(plVar2,(string *)&local_40);
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)&local_40,(ulong)optName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &arg->super_OptionArgProperties,&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void addOptName( Arg& arg, std::string const& optName )
        {
            if( optName.empty() )
                return;
            if( Detail::startsWith( optName, "--" ) ) {
                if( !arg.longName.empty() )
                    throw std::logic_error( "Only one long opt may be specified. '"
                        + arg.longName
                        + "' already specified, now attempting to add '"
                        + optName + "'" );
                arg.longName = optName.substr( 2 );
            }
            else if( Detail::startsWith( optName, "-" ) )
                arg.shortNames.push_back( optName.substr( 1 ) );
            else
                throw std::logic_error( "option must begin with - or --. Option was: '" + optName + "'" );
        }